

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O3

bool Rml::InterpolateEffectProperties
               (PropertyDictionary *properties,EffectDeclarationView *d0,EffectDeclarationView *d1,
               float alpha,Element *element)

{
  PropertyId id_00;
  EffectSpecification *pEVar1;
  size_t __n;
  ulong uVar2;
  code *pcVar3;
  ulong *puVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  PropertyMap *pPVar8;
  PropertyMap *this;
  size_t sVar9;
  ulong uVar10;
  PropertyDefinition *this_00;
  Property *pPVar11;
  pair<Rml::PropertyId,_Rml::Property> *pair_filled;
  NodePtr pDVar12;
  EffectDeclarationView *pEVar13;
  NodePtr pDVar14;
  Property *p0;
  EffectSpecification *this_01;
  Property *p1;
  uint8_t *puVar15;
  ulong *puVar16;
  const_iterator cVar17;
  const_iterator cVar18;
  PropertyId id;
  Property p;
  PropertyId local_b5;
  float local_b4;
  PropertyDictionary *local_b0;
  Element *local_a8;
  EffectDeclarationView *local_a0;
  EffectDeclarationView *local_98;
  NodePtr local_90;
  PropertySpecification *local_88;
  Property local_80;
  
  this_01 = d0->instancer;
  pEVar1 = d1->instancer;
  local_b4 = alpha;
  local_b0 = properties;
  local_a8 = element;
  if (this_01 == (EffectSpecification *)0x0) {
    pEVar13 = d1;
    this_01 = pEVar1;
    if (pEVar1 == (EffectSpecification *)0x0) {
      return false;
    }
  }
  else {
    pEVar13 = d0;
    if (pEVar1 != (EffectSpecification *)0x0) {
      if (this_01 != pEVar1) {
        return false;
      }
      __n = d0->type->_M_string_length;
      if (__n != d1->type->_M_string_length) {
        return false;
      }
      if ((__n != 0) &&
         (iVar6 = bcmp((d0->type->_M_dataplus)._M_p,(d1->type->_M_dataplus)._M_p,__n), iVar6 != 0))
      {
        return false;
      }
      iVar6 = PropertyDictionary::GetNumProperties(d0->properties);
      iVar7 = PropertyDictionary::GetNumProperties(d1->properties);
      if (iVar6 != iVar7) {
        return false;
      }
      if (d0->paint_area != d1->paint_area) {
        return false;
      }
      pPVar8 = PropertyDictionary::GetProperties(d0->properties);
      this = PropertyDictionary::GetProperties(d1->properties);
      cVar17 = robin_hood::detail::
               Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
               ::cbegin(pPVar8);
      pDVar14 = (NodePtr)pPVar8->mInfo;
      if (cVar17.mKeyVals == pDVar14) {
        return true;
      }
      do {
        puVar15 = cVar17.mInfo;
        pDVar12 = cVar17.mKeyVals;
        local_b5 = (pDVar12->mData).first;
        sVar9 = robin_hood::detail::
                Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                ::findIdx<Rml::PropertyId>(this,&local_b5);
        if (this->mKeyVals + sVar9 == (Node *)this->mInfo) {
          bVar5 = Assert("Incompatible decorator properties.",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementAnimation.cpp"
                         ,0x9a);
          if (bVar5) {
            return false;
          }
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        InterpolateProperties
                  (&local_80,&(pDVar12->mData).second,&this->mKeyVals[sVar9].mData.second,local_b4,
                   local_a8,(pDVar12->mData).second.definition);
        local_80.definition = (pDVar12->mData).second.definition;
        PropertyDictionary::SetProperty(local_b0,local_b5,&local_80);
        if (local_80.source.
            super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_80.source.
                     super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        Variant::~Variant(&local_80.value);
        pDVar12 = pDVar12 + 1;
        uVar10 = *(ulong *)(puVar15 + 1);
        if (uVar10 == 0) {
          puVar4 = (ulong *)(puVar15 + 9);
          do {
            puVar16 = puVar4;
            pDVar12 = pDVar12 + 8;
            uVar10 = *puVar16;
            puVar4 = puVar16 + 1;
          } while (uVar10 == 0);
        }
        else {
          puVar16 = (ulong *)(puVar15 + 1);
        }
        uVar2 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        uVar10 = uVar2 >> 3 & 0x1fffffff;
        cVar17.mInfo = (uint8_t *)((long)puVar16 + uVar10);
        cVar17.mKeyVals = pDVar12 + uVar10;
      } while (pDVar12 + uVar10 != pDVar14);
      return true;
    }
  }
  local_88 = EffectSpecification::GetPropertySpecification(this_01);
  pPVar8 = PropertyDictionary::GetProperties(pEVar13->properties);
  cVar18 = robin_hood::detail::
           Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
           ::cbegin(pPVar8);
  local_90 = (NodePtr)pPVar8->mInfo;
  if (cVar18.mKeyVals == local_90) {
    return true;
  }
  local_a0 = d0;
  local_98 = d1;
  do {
    puVar15 = cVar18.mInfo;
    pDVar14 = cVar18.mKeyVals;
    id_00 = (pDVar14->mData).first;
    this_00 = PropertySpecification::GetProperty(local_88,id_00);
    if (this_00 == (PropertyDefinition *)0x0) {
      return false;
    }
    p1 = &(pDVar14->mData).second;
    pPVar11 = PropertyDefinition::GetDefaultValue(this_00);
    p0 = p1;
    if (local_a0->instancer == (EffectSpecification *)0x0) {
      p0 = pPVar11;
    }
    if (local_98->instancer == (EffectSpecification *)0x0) {
      p1 = pPVar11;
    }
    InterpolateProperties(&local_80,p0,p1,local_b4,local_a8,(pDVar14->mData).second.definition);
    local_80.definition = (pDVar14->mData).second.definition;
    PropertyDictionary::SetProperty(local_b0,id_00,&local_80);
    if (local_80.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.source.
                 super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    Variant::~Variant(&local_80.value);
    pDVar14 = pDVar14 + 1;
    uVar10 = *(ulong *)(puVar15 + 1);
    if (uVar10 == 0) {
      puVar4 = (ulong *)(puVar15 + 9);
      do {
        puVar16 = puVar4;
        pDVar14 = pDVar14 + 8;
        uVar10 = *puVar16;
        puVar4 = puVar16 + 1;
      } while (uVar10 == 0);
    }
    else {
      puVar16 = (ulong *)(puVar15 + 1);
    }
    uVar2 = 0;
    if (uVar10 != 0) {
      for (; (uVar10 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    uVar10 = uVar2 >> 3 & 0x1fffffff;
    cVar18.mInfo = (uint8_t *)((long)puVar16 + uVar10);
    cVar18.mKeyVals = pDVar14 + uVar10;
  } while (pDVar14 + uVar10 != local_90);
  return this_00 != (PropertyDefinition *)0x0;
}

Assistant:

static bool InterpolateEffectProperties(PropertyDictionary& properties, const EffectDeclarationView& d0, const EffectDeclarationView& d1, float alpha,
	Element& element)
{
	if (d0 && d1)
	{
		// Both declarations are specified, check if they are compatible for interpolation.
		if (!d0.instancer || d0.instancer != d1.instancer || *d0.type != *d1.type ||
			d0.properties->GetNumProperties() != d1.properties->GetNumProperties() || d0.paint_area != d1.paint_area)
			return false;

		const auto& properties0 = d0.properties->GetProperties();
		const auto& properties1 = d1.properties->GetProperties();

		for (const auto& pair0 : properties0)
		{
			const PropertyId id = pair0.first;
			const Property& prop0 = pair0.second;

			auto it = properties1.find(id);
			if (it == properties1.end())
			{
				RMLUI_ERRORMSG("Incompatible decorator properties.");
				return false;
			}
			const Property& prop1 = it->second;

			Property p = InterpolateProperties(prop0, prop1, alpha, element, prop0.definition);
			p.definition = prop0.definition;
			properties.SetProperty(id, p);
		}
		return true;
	}
	else if ((d0 && !d1) || (!d0 && d1))
	{
		// One of the declarations is empty, interpolate against the default values of its type.
		const auto& d_filled = (d0 ? d0 : d1);

		const PropertySpecification& specification = d_filled.instancer->GetPropertySpecification();
		const PropertyMap& properties_filled = d_filled.properties->GetProperties();

		for (const auto& pair_filled : properties_filled)
		{
			const PropertyId id = pair_filled.first;
			const PropertyDefinition* underlying_definition = specification.GetProperty(id);
			if (!underlying_definition)
				return false;

			const Property& p_filled = pair_filled.second;
			const Property& p_default = *underlying_definition->GetDefaultValue();
			const Property& p_interp0 = (d0 ? p_filled : p_default);
			const Property& p_interp1 = (d1 ? p_filled : p_default);

			Property p = InterpolateProperties(p_interp0, p_interp1, alpha, element, p_filled.definition);
			p.definition = p_filled.definition;
			properties.SetProperty(id, p);
		}
		return true;
	}

	return false;
}